

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

int QFontDatabase::addApplicationFont(QString *fileName)

{
  char cVar1;
  int iVar2;
  Type *pTVar3;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *this;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *pQVar4;
  long in_FS_OFFSET;
  QDeadlineTimer QVar5;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QByteArray local_38;
  long local_20;
  
  this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *)
         &local_48;
  pQVar4 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *
           )&local_48;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char *)0x0;
  local_38.d.size = 0;
  QFileInfo::QFileInfo((QFileInfo *)&local_48,(QString *)fileName);
  cVar1 = QFileInfo::isNativePath();
  QFileInfo::~QFileInfo((QFileInfo *)&local_48);
  if (cVar1 == '\0') {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_48,(QString *)fileName);
    cVar1 = QFile::open(&local_48,1);
    if (cVar1 == '\0') {
      QFile::~QFile((QFile *)&local_48);
      iVar2 = -1;
      goto LAB_00496223;
    }
    addApplicationFont();
    this = pQVar4;
  }
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()(this);
  if (pTVar3 != (Type *)0x0) {
    QVar5.t2 = 0xffffffff;
    QVar5.type = 0x7fffffff;
    QVar5.t1 = (qint64)pTVar3;
    QRecursiveMutex::tryLock(QVar5);
  }
  QFontDatabasePrivate::instance();
  iVar2 = QFontDatabasePrivate::addAppFont
                    (&QFontDatabasePrivate::instance::instance,&local_38,fileName);
  if (pTVar3 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
LAB_00496223:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QFontDatabase::addApplicationFont(const QString &fileName)
{
    QByteArray data;
    if (!QFileInfo(fileName).isNativePath()) {
        QFile f(fileName);
        if (!f.open(QIODevice::ReadOnly))
            return -1;

        Q_TRACE(QFontDatabase_addApplicationFont, fileName);

        data = f.readAll();
    }
    QMutexLocker locker(fontDatabaseMutex());
    return QFontDatabasePrivate::instance()->addAppFont(data, fileName);
}